

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O2

RWNode * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createAlloc(LLVMReadWriteGraphBuilder *this,Instruction *Inst)

{
  User *Val;
  ID IVar1;
  RWNode *this_00;
  IntrinsicInst *this_01;
  Instruction *pIVar2;
  DataLayout *DL;
  Instruction *pIVar3;
  Offset local_40;
  Offset local_38;
  
  this_00 = ReadWriteGraph::create(&this->graph,ALLOC);
  pIVar3 = Inst;
  do {
    do {
      while( true ) {
        pIVar3 = *(Instruction **)(pIVar3 + 8);
        if (pIVar3 == (Instruction *)0x0) goto LAB_0011fc53;
        Val = *(User **)(pIVar3 + 0x18);
        if ((Val == (User *)0x0) || (Val[0x10] != (User)0x3c)) break;
        if (*(Instruction **)(Val + -0x40) == Inst) goto LAB_0011fc4c;
      }
      this_01 = (IntrinsicInst *)llvm::dyn_cast<llvm::MemIntrinsic,llvm::User>(Val);
    } while (this_01 == (IntrinsicInst *)0x0);
    IVar1 = llvm::IntrinsicInst::getIntrinsicID(this_01);
    if (IVar1 - 0xbf < 6) {
      pIVar2 = (Instruction *)0x0;
      if ((0x29U >> (IVar1 - 0xbf & 0x1f) & 1) != 0) {
        pIVar2 = *(Instruction **)
                  ((long)this_01 + (0x20 - (ulong)(uint)(*(int *)&this_01->field_0x14 << 5)));
      }
    }
    else {
      pIVar2 = (Instruction *)0x0;
    }
  } while (pIVar2 != Inst);
LAB_0011fc4c:
  this_00->has_address_taken = true;
LAB_0011fc53:
  if ((Inst != (Instruction *)0x0) && (Inst[0x10] == (Instruction)0x3a)) {
    DL = GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::getDataLayout
                   (&this->
                     super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>);
    local_38.offset = llvmutils::getAllocatedSize((AllocaInst *)Inst,DL);
    (this_00->super_SubgraphNode<dg::dda::RWNode>).size = local_38.offset;
    if (this_00->has_address_taken == false) {
      local_40.offset = 0;
      if (local_38.offset == 0) {
        local_38.offset = Offset::UNKNOWN;
      }
      RWNode::addOverwrites(this_00,this_00,&local_40,&local_38);
    }
  }
  return this_00;
}

Assistant:

RWNode *LLVMReadWriteGraphBuilder::createAlloc(const llvm::Instruction *Inst) {
    using namespace llvm;

    RWNode &node = create(RWNodeType::ALLOC);

    // check if the address of this alloca is taken
    for (auto I = Inst->use_begin(), E = Inst->use_end(); I != E; ++I) {
#if ((LLVM_VERSION_MAJOR == 3) && (LLVM_VERSION_MINOR < 5))
        auto *use = *I;
#else
        auto *use = I->getUser();
#endif
        if (auto *S = dyn_cast<StoreInst>(use)) {
            if (S->getValueOperand() == Inst) {
                node.setAddressTaken();
                break;
            }
        } else if (auto *MI = dyn_cast<MemIntrinsic>(use)) {
            if (getMemIntrinsicValueOp(MI) == Inst) {
                node.setAddressTaken();
                break;
            }
        } else if (const auto *I = dyn_cast<Instruction>(Inst)) {
            assert(!I->mayWriteToMemory() &&
                   "Unhandled memory-writing instruction");
            (void) I; // c++17 TODO: replace with [[maybe_unused]]
        }
    }

    if (const AllocaInst *AI = dyn_cast<AllocaInst>(Inst)) {
        auto size = llvmutils::getAllocatedSize(AI, getDataLayout());
        node.setSize(size);
        // this is a alloca that does not have the address taken,
        // therefore we must always access the last instance in loads
        // (even in recursive functions) and may terminate the search
        // for definitions of this alloca at this alloca
        if (!node.hasAddressTaken()) {
            node.addOverwrites(&node, 0, size > 0 ? size : Offset::UNKNOWN);
        }
    }
    return &node;
}